

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::Clear(CodeGeneratorResponse *this)

{
  string *psVar1;
  long lVar2;
  
  if (((this->_has_bits_[0] & 1) != 0) &&
     (psVar1 = this->error_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  if (0 < (this->file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar2 = 0;
    do {
      (**(code **)(*(this->file_).super_RepeatedPtrFieldBase.elements_[lVar2] + 0x20))();
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->file_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void CodeGeneratorResponse::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_error()) {
      if (error_ != &::google::protobuf::internal::kEmptyString) {
        error_->clear();
      }
    }
  }
  file_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}